

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall
cmOrderDirectoriesConstraintSOName::~cmOrderDirectoriesConstraintSOName
          (cmOrderDirectoriesConstraintSOName *this)

{
  cmOrderDirectoriesConstraintSOName *this_local;
  
  ~cmOrderDirectoriesConstraintSOName(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

cmOrderDirectoriesConstraintSOName(cmOrderDirectories* od,
                                     std::string const& file,
                                     const char* soname)
    : cmOrderDirectoriesConstraint(od, file)
    , SOName(soname ? soname : "")
  {
    if (this->SOName.empty()) {
      // Try to guess the soname.
      std::string soguess;
      if (cmSystemTools::GuessLibrarySOName(file, soguess)) {
        this->SOName = soguess;
      }
    }
  }